

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  uint uVar3;
  uint64_t uVar4;
  longlong lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  char *endptr;
  addrinfo *res;
  addrinfo local_68;
  addrinfo *local_38;
  
  uVar3 = bufferSizeMilliseconds;
  uVar8 = clockMicros;
  uVar10 = clockPeripheral;
  uVar12 = DMAprimaryChannel;
  uVar9 = DMAsecondaryChannel;
  uVar13 = socketPort;
  uVar7 = memAllocMode;
  uVar11 = cfgInternals;
LAB_001024e6:
  do {
    cfgInternals = uVar11;
    memAllocMode = uVar7;
    socketPort = uVar13;
    DMAsecondaryChannel = uVar9;
    DMAprimaryChannel = uVar12;
    clockPeripheral = uVar10;
    clockMicros = uVar8;
    bufferSizeMilliseconds = uVar3;
    iVar1 = getopt(argc,argv,"a:b:c:d:e:fgkln:mp:s:t:x:vV");
    pcVar14 = _optarg;
    uVar3 = bufferSizeMilliseconds;
    uVar8 = clockMicros;
    uVar10 = clockPeripheral;
    uVar12 = DMAprimaryChannel;
    uVar9 = DMAsecondaryChannel;
    uVar13 = socketPort;
    uVar7 = memAllocMode;
    uVar11 = cfgInternals;
    switch(iVar1) {
    case 0x56:
    case 0x76:
      printf("%d\n",0x49);
LAB_001029d2:
      exit(0);
    case 0x61:
      lVar5 = strtoll(_optarg,(char **)&local_68,0);
      uVar7 = -(uint)(*(char *)local_68._0_8_ != '\0') | (uint)lVar5;
      uVar3 = bufferSizeMilliseconds;
      uVar8 = clockMicros;
      uVar10 = clockPeripheral;
      uVar12 = DMAprimaryChannel;
      uVar9 = DMAsecondaryChannel;
      uVar13 = socketPort;
      uVar11 = cfgInternals;
      if (2 < uVar7) {
        pcVar14 = "invalid -a option (%d)";
        goto LAB_00102a40;
      }
      break;
    case 0x62:
      lVar5 = strtoll(_optarg,(char **)&local_68,0);
      uVar3 = -(uint)(*(char *)local_68._0_8_ != '\0') | (uint)lVar5;
      uVar8 = clockMicros;
      uVar10 = clockPeripheral;
      uVar12 = DMAprimaryChannel;
      uVar9 = DMAsecondaryChannel;
      uVar13 = socketPort;
      uVar7 = memAllocMode;
      uVar11 = cfgInternals;
      if (0x26ac < uVar3 - 100) {
        pcVar14 = "invalid -b option (%d)";
        goto LAB_00102a40;
      }
      break;
    case 99:
      lVar5 = strtoll(_optarg,(char **)&local_68,0);
      uVar11 = -(uint)(*(char *)local_68._0_8_ != '\0') | (uint)lVar5;
      uVar3 = bufferSizeMilliseconds;
      uVar8 = clockMicros;
      uVar10 = clockPeripheral;
      uVar12 = DMAprimaryChannel;
      uVar9 = DMAsecondaryChannel;
      uVar13 = socketPort;
      uVar7 = memAllocMode;
      if (0x7ff < uVar11) goto LAB_001029de;
      break;
    case 100:
      lVar5 = strtoll(_optarg,(char **)&local_68,0);
      uVar12 = -(uint)(*(char *)local_68._0_8_ != '\0') | (uint)lVar5;
      uVar3 = bufferSizeMilliseconds;
      uVar8 = clockMicros;
      uVar10 = clockPeripheral;
      uVar9 = DMAsecondaryChannel;
      uVar13 = socketPort;
      uVar7 = memAllocMode;
      uVar11 = cfgInternals;
      if (0xf < uVar12) {
        pcVar14 = "invalid -d option (%d)";
        goto LAB_00102a40;
      }
      break;
    case 0x65:
      lVar5 = strtoll(_optarg,(char **)&local_68,0);
      uVar9 = -(uint)(*(char *)local_68._0_8_ != '\0') | (uint)lVar5;
      uVar3 = bufferSizeMilliseconds;
      uVar8 = clockMicros;
      uVar10 = clockPeripheral;
      uVar12 = DMAprimaryChannel;
      uVar13 = socketPort;
      uVar7 = memAllocMode;
      uVar11 = cfgInternals;
      if (0xf < uVar9) {
        pcVar14 = "invalid -e option (%d)";
        goto LAB_00102a40;
      }
      break;
    case 0x66:
      ifFlags = ifFlags | 1;
      break;
    case 0x67:
      foreground = '\x01';
      break;
    case 0x6b:
      ifFlags = ifFlags | 2;
      break;
    case 0x6c:
      ifFlags = ifFlags | 4;
      break;
    case 0x6d:
      ifFlags = ifFlags | 8;
      break;
    case 0x6e:
      pcVar15 = getenv("PIGPIO_PORT");
      if (pcVar15 == (char *)0x0) {
        pcVar15 = "8888";
      }
      local_68.ai_addrlen = 0;
      local_68._20_4_ = 0;
      local_68.ai_addr = (sockaddr *)0x0;
      local_68.ai_canonname = (char *)0x0;
      local_68.ai_next = (addrinfo *)0x0;
      local_68.ai_socktype = 1;
      local_68.ai_protocol = 0;
      local_68._0_8_ = (char *)0x200000002;
      iVar1 = getaddrinfo(pcVar14,pcVar15,&local_68,&local_38);
      uVar11 = 0;
      if (iVar1 == 0) {
        uVar11 = *(uint32_t *)(local_38->ai_addr->sa_data + 2);
        freeaddrinfo(local_38);
      }
      if ((uVar11 == 0) || (0xff < numSockNetAddr)) {
        pcVar15 = "invalid -n option (%s)";
        pcVar14 = _optarg;
        goto LAB_00102a20;
      }
      lVar6 = (long)numSockNetAddr;
      numSockNetAddr = numSockNetAddr + 1;
      sockNetAddr[lVar6] = uVar11;
      uVar3 = bufferSizeMilliseconds;
      uVar8 = clockMicros;
      uVar10 = clockPeripheral;
      uVar12 = DMAprimaryChannel;
      uVar9 = DMAsecondaryChannel;
      uVar13 = socketPort;
      uVar7 = memAllocMode;
      uVar11 = cfgInternals;
      break;
    case 0x70:
      lVar5 = strtoll(_optarg,(char **)&local_68,0);
      uVar13 = -(uint)(*(char *)local_68._0_8_ != '\0') | (uint)lVar5;
      uVar3 = bufferSizeMilliseconds;
      uVar8 = clockMicros;
      uVar10 = clockPeripheral;
      uVar12 = DMAprimaryChannel;
      uVar9 = DMAsecondaryChannel;
      uVar7 = memAllocMode;
      uVar11 = cfgInternals;
      if (0x7900 < uVar13 - 0x400) goto LAB_00102a27;
      break;
    case 0x73:
      lVar5 = strtoll(_optarg,(char **)&local_68,0);
      uVar8 = -(uint)(*(char *)local_68._0_8_ != '\0') | (uint)lVar5;
      if (10 < uVar8) goto LAB_00102a47;
      uVar3 = bufferSizeMilliseconds;
      uVar10 = clockPeripheral;
      uVar12 = DMAprimaryChannel;
      uVar9 = DMAsecondaryChannel;
      uVar13 = socketPort;
      uVar7 = memAllocMode;
      uVar11 = cfgInternals;
      if ((0x536U >> (uVar8 & 0x1f) & 1) == 0) goto LAB_00102a47;
      break;
    case 0x74:
      goto switchD_00102507_caseD_74;
    case 0x78:
      uVar4 = strtoll(_optarg,(char **)&local_68,0);
      if (*(char *)local_68._0_8_ != '\0') {
        pcVar15 = "invalid -x option (%s)";
        pcVar14 = _optarg;
LAB_00102a20:
        fatal(pcVar15,pcVar14);
LAB_00102a27:
        pcVar14 = "invalid -p option (%d)";
        goto LAB_00102a40;
      }
      updateMaskSet = '\x01';
      uVar3 = bufferSizeMilliseconds;
      uVar8 = clockMicros;
      uVar10 = clockPeripheral;
      uVar12 = DMAprimaryChannel;
      uVar9 = DMAsecondaryChannel;
      uVar13 = socketPort;
      updateMask = uVar4;
      uVar7 = memAllocMode;
      uVar11 = cfgInternals;
      break;
    default:
      if (iVar1 == -1) {
        if (foreground == '\0') {
          _Var2 = fork();
          if (_Var2 < 0) {
            exit(1);
          }
          if (_Var2 != 0) goto LAB_001029d2;
          umask(0);
          _Var2 = setsid();
          if (_Var2 < 0) {
            pcVar14 = "setsid failed (%m)";
            goto LAB_00102a83;
          }
          iVar1 = chdir("/");
          if (iVar1 < 0) {
            pcVar14 = "chdir failed (%m)";
            goto LAB_00102a83;
          }
          fclose(_stdin);
          fclose(_stdout);
        }
        gpioCfgBufferSize(bufferSizeMilliseconds);
        gpioCfgClock(clockMicros,clockPeripheral,0);
        gpioCfgInterfaces(ifFlags);
        gpioCfgDMAchannels(DMAprimaryChannel,DMAsecondaryChannel);
        gpioCfgSocketPort(socketPort);
        gpioCfgMemAlloc(memAllocMode);
        if (updateMaskSet == '\x01') {
          gpioCfgPermissions(updateMask);
        }
        gpioCfgNetAddr(numSockNetAddr,sockNetAddr);
        gpioCfgSetInternals(cfgInternals);
        iVar1 = gpioInitialise();
        if (iVar1 < 0) {
          pcVar14 = "Can\'t initialise pigpio library";
LAB_00102a83:
          fatal(pcVar14);
          halt_baddata();
        }
        unlink("/dev/pigerr");
        mkfifo("/dev/pigerr",0x1b4);
        iVar1 = chmod("/dev/pigerr",0x1b4);
        if (-1 < iVar1) {
          errFifo = (FILE *)freopen("/dev/pigerr","w+",_stderr);
          if ((FILE *)errFifo == (FILE *)0x0) {
            main_cold_1();
            return 0;
          }
          iVar1 = fileno((FILE *)errFifo);
          uVar3 = fcntl(iVar1,3,0);
          iVar1 = fileno((FILE *)errFifo);
          fcntl(iVar1,4,(ulong)(uVar3 | 0x800));
          gpioSetSignalFunc(1,terminate);
          gpioSetSignalFunc(0xf,terminate);
          do {
            sleep(5);
            fflush((FILE *)errFifo);
          } while( true );
        }
        pcVar15 = "chmod %s failed (%m)";
        pcVar14 = "/dev/pigerr";
        goto LAB_00102a20;
      }
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x75:
    case 0x77:
      main_cold_2();
LAB_001029de:
      pcVar14 = "invalid -c option (%x)";
      goto LAB_00102a40;
    }
  } while( true );
switchD_00102507_caseD_74:
  lVar5 = strtoll(_optarg,(char **)&local_68,0);
  uVar10 = -(uint)(*(char *)local_68._0_8_ != '\0') | (uint)lVar5;
  uVar3 = bufferSizeMilliseconds;
  uVar8 = clockMicros;
  uVar12 = DMAprimaryChannel;
  uVar9 = DMAsecondaryChannel;
  uVar13 = socketPort;
  uVar7 = memAllocMode;
  uVar11 = cfgInternals;
  if (1 < uVar10) {
    pcVar14 = "invalid -t option (%d)";
LAB_00102a40:
    do {
      fatal(pcVar14);
LAB_00102a47:
      pcVar14 = "invalid -s option (%d)";
    } while( true );
  }
  goto LAB_001024e6;
}

Assistant:

int main(int argc, char **argv)
{
   pid_t pid;
   int flags;

   /* check command line parameters */

   initOpts(argc, argv);

   if (!foreground) {
      /* Fork off the parent process */

      pid = fork();

      if (pid < 0) { exit(EXIT_FAILURE); }

      /* If we got a good PID, then we can exit the parent process. */

      if (pid > 0) { exit(EXIT_SUCCESS); }

      /* Change the file mode mask */

      umask(0);

      /* Open any logs here */

      /* NONE */

      /* Create a new SID for the child process */

      if (setsid() < 0) fatal("setsid failed (%m)");

      /* Change the current working directory */

      if ((chdir("/")) < 0) fatal("chdir failed (%m)");

      /* Close out the standard file descriptors */

      fclose(stdin);
      fclose(stdout);
   }

   /* configure library */

   gpioCfgBufferSize(bufferSizeMilliseconds);

   gpioCfgClock(clockMicros, clockPeripheral, 0);

   gpioCfgInterfaces(ifFlags);

   gpioCfgDMAchannels(DMAprimaryChannel, DMAsecondaryChannel);

   gpioCfgSocketPort(socketPort);

   gpioCfgMemAlloc(memAllocMode);

   if (updateMaskSet) gpioCfgPermissions(updateMask);

   gpioCfgNetAddr(numSockNetAddr, sockNetAddr);

   gpioCfgSetInternals(cfgInternals);

   /* start library */

   if (gpioInitialise()< 0) fatal("Can't initialise pigpio library");

   /* create pipe for error reporting */

   unlink(PI_ERRFIFO);

   mkfifo(PI_ERRFIFO, 0664);

   if (chmod(PI_ERRFIFO, 0664) < 0)
      fatal("chmod %s failed (%m)", PI_ERRFIFO);

   errFifo = freopen(PI_ERRFIFO, "w+", stderr);

   if (errFifo)
   {
      /* set stderr non-blocking */

      flags = fcntl(fileno(errFifo), F_GETFL, 0);
      fcntl(fileno(errFifo), F_SETFL, flags | O_NONBLOCK);

      /* request SIGHUP/SIGTERM from libarary for termination */

      gpioSetSignalFunc(SIGHUP, terminate);
      gpioSetSignalFunc(SIGTERM, terminate);

      /* sleep forever */

      while (1)
      {
         /* cat /dev/pigerr to view daemon errors */

         sleep(5);

         fflush(errFifo);
      }
   }
   else
   {
      fprintf(stderr, "freopen failed (%m)");

      gpioTerminate();
   }

   return 0;
}